

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

void __thiscall PacketBuilder::~PacketBuilder(PacketBuilder *this)

{
  size_t __n;
  
  __n = (this->data)._M_string_length;
  if (__n != 0) {
    memset((this->data)._M_dataplus._M_p,0,__n);
  }
  std::__cxx11::string::~string((string *)&this->data);
  return;
}

Assistant:

PacketBuilder::~PacketBuilder()
{
	std::fill(UTIL_RANGE(this->data), '\0');
}